

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O3

int MpiWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  uint uVar1;
  size_t TimeStep;
  size_t __n;
  long lVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  
  uVar1 = *Handle_v;
  TimeStep = *(size_t *)((long)Handle_v + 8);
  __n = *(size_t *)((long)Handle_v + 0x10);
  lVar2 = *(long *)((long)Handle_v + 0x18);
  lVar3 = *(long *)((long)Handle_v + 0x28);
  (*Svcs->verbose)(*(void **)((long)Handle_v + 0x38),5,
                   "Waiting for completion of memory read to rank %d, condition %d,timestep=%d, is_local=%d\n"
                   ,(ulong)*(uint *)((long)Handle_v + 0x48),(ulong)uVar1,TimeStep,
                   *(undefined4 *)((long)Handle_v + 0x4c));
  if (*(int *)((long)Handle_v + 0x4c) == 1) {
    pcVar5 = LoadTimeStep(*(MpiStreamWR *)(lVar3 + 0x18),TimeStep);
    if (pcVar5 != (char *)0x0) {
      memcpy(*(void **)((long)Handle_v + 0x40),pcVar5 + lVar2,__n);
    }
    uVar4 = (uint)(pcVar5 != (char *)0x0);
  }
  else {
    uVar4 = CMCondition_wait(*(undefined8 *)((long)Handle_v + 0x30),uVar1);
  }
  if (uVar4 == 0) {
    (*Svcs->verbose)(*(void **)((long)Handle_v + 0x38),1,
                     "Remote memory read to rank %d with condition %d has FAILEDbecause of writer failure\n"
                     ,(ulong)*(uint *)((long)Handle_v + 0x48),(ulong)uVar1);
  }
  else {
    (*Svcs->verbose)(*(void **)((long)Handle_v + 0x38),5,
                     "Memory read to rank %d with condition %d andlength %zu has completed\n",
                     (ulong)*(uint *)((long)Handle_v + 0x48),(ulong)uVar1,__n);
  }
  free(Handle_v);
  return uVar4;
}

Assistant:

static int MpiWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    const MpiCompletionHandle Handle = (MpiCompletionHandle)Handle_v;
    const struct _MpiReadRequestMsg Request = Handle->ReadRequest;
    int Ret = 0;

    Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                  "Waiting for completion of memory read to rank %d, condition %d,"
                  "timestep=%d, is_local=%d\n",
                  Handle->DestinationRank, Request.NotifyCondition, Request.TimeStep,
                  Handle->CommType);

    // If possible, read locally
    if (Handle->CommType == MPI_DP_LOCAL)
    {
        const MpiStreamWR StreamWR = ((MpiStreamWPR)Request.StreamWPR)->StreamWR;
        char *LoadedBuffer = LoadTimeStep(StreamWR, Request.TimeStep);
        if (LoadedBuffer)
        {
            memcpy(Handle->Buffer, LoadedBuffer + Request.Offset, Request.Length);
        }
        Ret = (LoadedBuffer != NULL);
    }
    // Otherwise, wait for remote read
    else
    {
        Ret = CMCondition_wait(Handle->cm, Request.NotifyCondition);
    }

    // Display result
    if (Ret)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Memory read to rank %d with condition %d and"
                      "length %zu has completed\n",
                      Handle->DestinationRank, Request.NotifyCondition, Request.Length);
    }
    else
    {
        Svcs->verbose(Handle->CPStream, DPCriticalVerbose,
                      "Remote memory read to rank %d with condition %d has FAILED"
                      "because of "
                      "writer failure\n",
                      Handle->DestinationRank, Request.NotifyCondition);
    }

    free(Handle);
    return Ret;
}